

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

BBox * __thiscall CMU462::Edge::bounds(BBox *__return_storage_ptr__,Edge *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pFVar3;
  BBox local_d0;
  BBox local_88;
  _List_const_iterator<CMU462::Halfedge> local_40;
  _List_const_iterator<CMU462::Halfedge> local_38;
  _List_const_iterator<CMU462::Face> local_30;
  FaceCIter f1;
  _List_const_iterator<CMU462::Face> local_20;
  FaceCIter f0;
  Edge *this_local;
  BBox *box;
  
  f0._M_node = (_List_node_base *)this;
  BBox::BBox(__return_storage_ptr__);
  f1._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                     ((_List_const_iterator<CMU462::Halfedge> *)&f1);
  local_20._M_node = (_List_node_base *)Halfedge::face(pHVar2);
  local_40._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_40);
  local_38._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_38);
  local_30._M_node = (_List_node_base *)Halfedge::face(pHVar2);
  pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_20);
  bVar1 = Face::isBoundary(pFVar3);
  if (!bVar1) {
    pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_20);
    (*(pFVar3->super_HalfedgeElement)._vptr_HalfedgeElement[1])(&local_88);
    BBox::expand(__return_storage_ptr__,&local_88);
  }
  pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_30);
  bVar1 = Face::isBoundary(pFVar3);
  if (!bVar1) {
    pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_30);
    (*(pFVar3->super_HalfedgeElement)._vptr_HalfedgeElement[1])(&local_d0);
    BBox::expand(__return_storage_ptr__,&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Edge::bounds() const
  {
    BBox box;

    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();

    if( !f0->isBoundary() ) box.expand( f0->bounds() );
    if( !f1->isBoundary() ) box.expand( f1->bounds() );

    return box;
  }